

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

Position __thiscall indk::operator/(indk *this,Position *P,float D)

{
  uint _Xm;
  float *extraout_RDX;
  uint i;
  ulong uVar1;
  Position PVar2;
  vector<float,_std::allocator<float>_> PV;
  float local_6c;
  _Vector_base<float,_std::allocator<float>_> local_68;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar1 = 0; uVar1 < P->DimensionsCount; uVar1 = uVar1 + 1) {
    local_6c = P->X[uVar1] / D;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)&local_68,&local_6c);
  }
  _Xm = P->Xm;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,
             (vector<float,_std::allocator<float>_> *)&local_68);
  Position::Position((Position *)this,_Xm,(vector<float,_std::allocator<float>_> *)&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
  PVar2.X = extraout_RDX;
  PVar2._0_8_ = this;
  return PVar2;
}

Assistant:

indk::Position indk::operator/(const indk::Position &P, float D) {
    std::vector<float> PV;
    for (unsigned int i = 0; i < P.getDimensionsCount(); i++) {
        PV.push_back(P.getPositionValue(i)/D);
    }
    return indk::Position(P.getXm(), PV);
}